

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

void __thiscall
nlohmann::detail::
parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::input_stream_adapter>
::parse(parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::input_stream_adapter>
        *this,bool strict,
       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
       *result)

{
  size_t sVar1;
  token_type tVar2;
  value_t t;
  json_value *this_00;
  json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  sdp;
  string local_1d0;
  string local_1b0;
  string local_190;
  undefined **local_170 [2];
  runtime_error local_160 [24];
  position_t local_148;
  _Any_data local_130;
  code *local_120;
  undefined1 local_110 [40];
  bool local_e8;
  bool local_e7;
  bool local_98;
  value_t local_58;
  json_value local_50;
  undefined1 local_48;
  json_value local_40;
  value_t local_38;
  json_value local_30;
  
  if ((this->callback).super__Function_base._M_manager == (_Manager_type)0x0) {
    local_e7 = this->allow_exceptions;
    local_110._8_8_ = (pointer)0x0;
    local_110._16_8_ = (pointer)0x0;
    local_110._24_8_ = (pointer)0x0;
    local_110._32_8_ =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *)0x0;
    local_e8 = false;
    local_110._0_8_ = result;
    parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::input_stream_adapter>
    ::
    sax_parse_internal<nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
              ((parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::input_stream_adapter>
                *)this,(json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_110);
    if (strict) {
      tVar2 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::input_stream_adapter>
              ::scan(&this->m_lexer);
      this->last_token = tVar2;
      if (tVar2 != end_of_input) {
        sVar1 = (this->m_lexer).position.chars_read_total;
        lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::input_stream_adapter>
        ::get_token_string(&local_190,&this->m_lexer);
        local_148.lines_read = (this->m_lexer).position.lines_read;
        local_148.chars_read_total._0_4_ = (undefined4)(this->m_lexer).position.chars_read_total;
        local_148.chars_read_total._4_4_ =
             *(undefined4 *)((long)&(this->m_lexer).position.chars_read_total + 4);
        local_148.chars_read_current_line._0_4_ =
             (undefined4)(this->m_lexer).position.chars_read_current_line;
        local_148.chars_read_current_line._4_4_ =
             *(undefined4 *)((long)&(this->m_lexer).position.chars_read_current_line + 4);
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"value","");
        exception_message(&local_1b0,this,end_of_input,&local_1d0);
        parse_error::create((parse_error *)local_170,0x65,&local_148,&local_1b0);
        json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::parse_error((json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)local_110,sVar1,&local_190,(exception *)local_170);
        local_170[0] = &PTR__exception_0028cb50;
        std::runtime_error::~runtime_error
                  ((runtime_error *)((long)&((parse_error *)local_170)->super_exception + 0x10));
        std::exception::~exception((exception *)local_170);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if (local_e8 == true) {
      local_58 = result->m_type;
      result->m_type = discarded;
      local_50 = result->m_value;
      (result->m_value).object = (object_t *)0x0;
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::json_value::destroy((json_value *)&local_50.boolean,local_58);
    }
    if ((pointer)local_110._8_8_ == (pointer)0x0) {
      return;
    }
    operator_delete((void *)local_110._8_8_,local_110._24_8_ - local_110._8_8_);
    return;
  }
  std::
  function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
  ::function((function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
              *)&local_130,&this->callback);
  json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::json_sax_dom_callback_parser
            ((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)local_110,result,(parser_callback_t *)&local_130,this->allow_exceptions);
  if (local_120 != (code *)0x0) {
    (*local_120)(&local_130,&local_130,__destroy_functor);
  }
  parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::input_stream_adapter>
  ::
  sax_parse_internal<nlohmann::detail::json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ((parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::input_stream_adapter>
              *)this,(json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)local_110);
  if (strict) {
    tVar2 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::input_stream_adapter>
            ::scan(&this->m_lexer);
    this->last_token = tVar2;
    if (tVar2 != end_of_input) {
      sVar1 = (this->m_lexer).position.chars_read_total;
      lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::input_stream_adapter>
      ::get_token_string(&local_190,&this->m_lexer);
      local_148.lines_read = (this->m_lexer).position.lines_read;
      local_148.chars_read_total._0_4_ = (undefined4)(this->m_lexer).position.chars_read_total;
      local_148.chars_read_total._4_4_ =
           *(undefined4 *)((long)&(this->m_lexer).position.chars_read_total + 4);
      local_148.chars_read_current_line._0_4_ =
           (undefined4)(this->m_lexer).position.chars_read_current_line;
      local_148.chars_read_current_line._4_4_ =
           *(undefined4 *)((long)&(this->m_lexer).position.chars_read_current_line + 4);
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"value","");
      exception_message(&local_1b0,this,end_of_input,&local_1d0);
      parse_error::create((parse_error *)local_170,0x65,&local_148,&local_1b0);
      json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::parse_error((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)local_110,sVar1,&local_190,(exception *)local_170);
      local_170[0] = &PTR__exception_0028cb50;
      std::runtime_error::~runtime_error
                ((runtime_error *)((long)&((parse_error *)local_170)->super_exception + 0x10));
      std::exception::~exception((exception *)local_170);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if (local_98 == true) {
    this_00 = &local_30;
    t = result->m_type;
    result->m_type = discarded;
    local_30 = result->m_value;
    (result->m_value).object = (object_t *)0x0;
    local_38 = t;
  }
  else {
    if (result->m_type != discarded) goto LAB_00136f8b;
    this_00 = &local_40;
    result->m_type = null;
    local_48 = 9;
    local_40 = result->m_value;
    (result->m_value).object = (object_t *)0x0;
    t = discarded;
  }
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::json_value::destroy((json_value *)&this_00->boolean,t);
LAB_00136f8b:
  json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~json_sax_dom_callback_parser
            ((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)local_110);
  return;
}

Assistant:

void parse(const bool strict, BasicJsonType& result)
    {
        if (callback)
        {
            json_sax_dom_callback_parser<BasicJsonType> sdp(result, callback, allow_exceptions);
            sax_parse_internal(&sdp);
            result.assert_invariant();

            // in strict mode, input must be completely read
            if (strict and (get_token() != token_type::end_of_input))
            {
                sdp.parse_error(m_lexer.get_position(),
                                m_lexer.get_token_string(),
                                parse_error::create(101, m_lexer.get_position(),
                                                    exception_message(token_type::end_of_input, "value")));
            }

            // in case of an error, return discarded value
            if (sdp.is_errored())
            {
                result = value_t::discarded;
                return;
            }

            // set top-level value to null if it was discarded by the callback
            // function
            if (result.is_discarded())
            {
                result = nullptr;
            }
        }
        else
        {
            json_sax_dom_parser<BasicJsonType> sdp(result, allow_exceptions);
            sax_parse_internal(&sdp);
            result.assert_invariant();

            // in strict mode, input must be completely read
            if (strict and (get_token() != token_type::end_of_input))
            {
                sdp.parse_error(m_lexer.get_position(),
                                m_lexer.get_token_string(),
                                parse_error::create(101, m_lexer.get_position(),
                                                    exception_message(token_type::end_of_input, "value")));
            }

            // in case of an error, return discarded value
            if (sdp.is_errored())
            {
                result = value_t::discarded;
                return;
            }
        }
    }